

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O1

bool __thiscall pbrt::DisplayItem::Display(DisplayItem *this,IPCChannel *ipcChannel)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  pointer pIVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_> displayValues;
  vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_> local_70;
  _Any_data *local_58;
  Bounds2<int> local_50;
  span<pstd::span<float>_> local_40;
  
  if (this->openedImage == false) {
    bVar6 = SendOpenImage(this,ipcChannel);
    if (!bVar6) {
      return false;
    }
    this->openedImage = true;
  }
  std::vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_>::vector
            (&local_70,
             (long)(this->channelBuffers).
                   super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->channelBuffers).
                   super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_50);
  pIVar11 = (this->channelBuffers).
            super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->channelBuffers).
      super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar11) {
    lVar9 = 0;
    uVar12 = 0;
    do {
      *(long *)((long)&(local_70.
                        super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->ptr + lVar9) =
           (long)(&pIVar11->channelValuesOffset)[lVar9] +
           *(long *)((long)&(pIVar11->buffer).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar9 * 4);
      *(undefined8 *)
       ((long)&(local_70.super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->n + lVar9) = 0x4000;
      uVar12 = uVar12 + 1;
      pIVar11 = (this->channelBuffers).
                super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x10;
    } while (uVar12 < (ulong)((long)(this->channelBuffers).
                                    super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar11 >> 6)
            );
  }
  iVar14 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  bVar6 = iVar14 < 1;
  if (0 < iVar14) {
    local_58 = (_Any_data *)&this->getTileValues;
    iVar14 = 0;
    iVar15 = 0;
    do {
      iVar8 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
      if (0 < iVar8) {
        iVar10 = 0;
        do {
          iVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          if (iVar15 + 0x80 <= iVar2) {
            iVar2 = iVar15 + 0x80;
          }
          iVar1 = iVar10 + 0x80;
          if (iVar1 <= iVar8) {
            iVar8 = iVar1;
          }
          pIVar11 = (this->channelBuffers).
                    super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->channelBuffers).
              super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
              ._M_impl.super__Vector_impl_data._M_finish != pIVar11) {
            lVar9 = 0;
            uVar12 = 0;
            do {
              lVar3 = *(long *)((long)&(pIVar11->buffer).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar9);
              lVar13 = (long)*(int *)((long)&pIVar11->tileBoundsOffset + lVar9);
              *(int *)(lVar3 + lVar13) = iVar10;
              *(int *)(lVar3 + 4 + lVar13) = iVar15;
              *(int *)(lVar3 + 8 + lVar13) = iVar8 - iVar10;
              *(int *)(lVar3 + 0xc + lVar13) = iVar2 - iVar15;
              *(int *)((long)&pIVar11->setCount + lVar9) = (iVar2 - iVar15) * (iVar8 - iVar10);
              uVar12 = uVar12 + 1;
              pIVar11 = (this->channelBuffers).
                        super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = lVar9 + 0x40;
            } while (uVar12 < (ulong)((long)(this->channelBuffers).
                                            super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pIVar11 >> 6));
          }
          iVar4 = iVar10;
          if (iVar8 < iVar10) {
            iVar4 = iVar8;
          }
          iVar5 = iVar15;
          if (iVar2 < iVar15) {
            iVar5 = iVar2;
          }
          local_50.pMin.super_Tuple2<pbrt::Point2,_int>.y = iVar5;
          local_50.pMin.super_Tuple2<pbrt::Point2,_int>.x = iVar4;
          if (iVar8 < iVar10) {
            iVar8 = iVar10;
          }
          if (iVar2 < iVar15) {
            iVar2 = iVar15;
          }
          local_50.pMax.super_Tuple2<pbrt::Point2,_int>.y = iVar2;
          local_50.pMax.super_Tuple2<pbrt::Point2,_int>.x = iVar8;
          local_40.n = (long)local_70.
                             super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_70.
                             super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4;
          local_40.ptr = local_70.
                         super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          if ((this->getTileValues).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->getTileValues)._M_invoker)(local_58,&local_50,&local_40);
          pIVar11 = (this->channelBuffers).
                    super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->channelBuffers).
              super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
              ._M_impl.super__Vector_impl_data._M_finish != pIVar11) {
            lVar9 = 0;
            uVar12 = 0;
            do {
              bVar7 = ImageChannelBuffer::SendIfChanged
                                ((ImageChannelBuffer *)
                                 ((long)&(pIVar11->buffer).
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar9),
                                 ipcChannel,iVar14);
              if (!bVar7) {
                this->openedImage = false;
                goto LAB_00288a7d;
              }
              uVar12 = uVar12 + 1;
              pIVar11 = (this->channelBuffers).
                        super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = lVar9 + 0x40;
            } while (uVar12 < (ulong)((long)(this->channelBuffers).
                                            super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pIVar11 >> 6));
          }
          iVar14 = iVar14 + 1;
          iVar8 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
          iVar10 = iVar1;
        } while (iVar1 < iVar8);
      }
      iVar15 = iVar15 + 0x80;
      iVar8 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      bVar6 = iVar8 <= iVar15;
    } while (iVar15 < iVar8);
  }
LAB_00288a7d:
  if (local_70.super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool DisplayItem::Display(IPCChannel &ipcChannel) {
    if (!openedImage) {
        if (!SendOpenImage(ipcChannel))
            // maybe next time
            return false;
        openedImage = true;
    }

    std::vector<pstd::span<Float>> displayValues(channelBuffers.size());
    for (int c = 0; c < channelBuffers.size(); ++c) {
        Float *ptr = (Float *)(channelBuffers[c].buffer.data() +
                               channelBuffers[c].channelValuesOffset);
        displayValues[c] = pstd::MakeSpan(ptr, tileSize * tileSize);
    }

    int tileIndex = 0;
    for (int y = 0; y < resolution.y; y += tileSize)
        for (int x = 0; x < resolution.x; x += tileSize, ++tileIndex) {
            int height = std::min(y + tileSize, resolution.y) - y;
            int width = std::min(x + tileSize, resolution.x) - x;

            for (int c = 0; c < channelBuffers.size(); ++c)
                channelBuffers[c].SetTileBounds(x, y, width, height);

            Bounds2i b(Point2i(x, y), Point2i(x + width, y + height));
            getTileValues(b, pstd::MakeSpan(displayValues));

            // Send the RGB buffers only if they're different than
            // the last version sent.
            for (int c = 0; c < channelBuffers.size(); ++c)
                if (!channelBuffers[c].SendIfChanged(ipcChannel, tileIndex)) {
                    // Welp. Stop for now...
                    openedImage = false;
                    return false;
                }
        }

    return true;
}